

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::HasOnlySupportedRefs
          (LocalAccessChainConvertPass *this,uint32_t ptrId)

{
  uint32_t id;
  bool bVar1;
  DefUseManager *this_00;
  anon_class_8_1_8991fb9c local_58;
  function<bool_(spvtools::opt::Instruction_*)> local_50;
  _Node_iterator_base<unsigned_int,_false> local_30;
  _Node_iterator_base<unsigned_int,_false> local_28;
  uint32_t local_1c;
  LocalAccessChainConvertPass *pLStack_18;
  uint32_t ptrId_local;
  LocalAccessChainConvertPass *this_local;
  
  local_1c = ptrId;
  pLStack_18 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&this->supported_ref_ptrs_,&local_1c);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(&this->supported_ref_ptrs_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    id = local_1c;
    local_58.this = this;
    std::function<bool(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LocalAccessChainConvertPass::HasOnlySupportedRefs(unsigned_int)::__0,void>
              ((function<bool(spvtools::opt::Instruction*)> *)&local_50,&local_58);
    bVar1 = analysis::DefUseManager::WhileEachUser(this_00,id,&local_50);
    std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_50);
    if (bVar1) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&this->supported_ref_ptrs_,&local_1c);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LocalAccessChainConvertPass::HasOnlySupportedRefs(uint32_t ptrId) {
  if (supported_ref_ptrs_.find(ptrId) != supported_ref_ptrs_.end()) return true;
  if (get_def_use_mgr()->WhileEachUser(ptrId, [this](Instruction* user) {
        if (user->GetCommonDebugOpcode() == CommonDebugInfoDebugValue ||
            user->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
          return true;
        }
        spv::Op op = user->opcode();
        if (IsNonPtrAccessChain(op) || op == spv::Op::OpCopyObject) {
          if (!HasOnlySupportedRefs(user->result_id())) {
            return false;
          }
        } else if (op != spv::Op::OpStore && op != spv::Op::OpLoad &&
                   op != spv::Op::OpName && !IsNonTypeDecorate(op)) {
          return false;
        }
        return true;
      })) {
    supported_ref_ptrs_.insert(ptrId);
    return true;
  }
  return false;
}